

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

fio_protocol_s *
http1_new(uintptr_t uuid,http_settings_s *settings,void *unread_data,size_t unread_length)

{
  http_fio_protocol_s *__dest;
  int *piVar1;
  code *local_140;
  code *local_138;
  code *local_128;
  http_settings_s *local_110;
  void *local_108;
  undefined8 local_50;
  undefined1 local_3f;
  http_fio_protocol_s *local_38;
  http1pr_s *p;
  size_t unread_length_local;
  void *unread_data_local;
  http_settings_s *settings_local;
  uintptr_t uuid_local;
  
  if ((unread_data == (void *)0x0) || (unread_length < 0x2001)) {
    p = (http1pr_s *)unread_length;
    unread_length_local = (size_t)unread_data;
    unread_data_local = settings;
    settings_local = (http_settings_s *)uuid;
    __dest = (http_fio_protocol_s *)fio_malloc(0x2108);
    local_38 = __dest;
    if (__dest == (http_fio_protocol_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http1.c:801"
                      );
      }
      kill(0,2);
      piVar1 = __errno_location();
      exit(*piVar1);
    }
    memset(&local_140,0,0x108);
    local_140 = http1_on_data_first_time;
    local_138 = http1_on_ready;
    local_128 = http1_on_close;
    local_110 = settings_local;
    local_108 = unread_data_local;
    local_50 = *(undefined8 *)((long)unread_data_local + 0x38);
    local_3f = *(undefined1 *)((long)unread_data_local + 0x7b);
    memcpy(__dest,&local_140,0x108);
    http_s_new((http_s *)&local_38[1].protocol.rsv,local_38,&HTTP1_VTABLE);
    if ((unread_length_local != 0) && (p < (http1pr_s *)0x2001)) {
      memcpy((void *)((long)&local_38[4].protocol.on_data + 3),(void *)unread_length_local,(size_t)p
            );
      local_38[3].protocol.rsv = (size_t)p;
    }
    fio_attach((intptr_t)settings_local,&local_38->protocol);
    if ((unread_length_local != 0) && (p < (http1pr_s *)0x2001)) {
      fio_force_event((intptr_t)settings_local,FIO_EVENT_ON_DATA);
    }
    uuid_local = (uintptr_t)local_38;
  }
  else {
    uuid_local = 0;
  }
  return (fio_protocol_s *)uuid_local;
}

Assistant:

fio_protocol_s *http1_new(uintptr_t uuid, http_settings_s *settings,
                          void *unread_data, size_t unread_length) {
  if (unread_data && unread_length > HTTP_MAX_HEADER_LENGTH)
    return NULL;
  http1pr_s *p = fio_malloc(sizeof(*p) + HTTP_MAX_HEADER_LENGTH);
  // FIO_LOG_DEBUG("Allocated HTTP/1.1 protocol at. %p", (void *)p);
  FIO_ASSERT_ALLOC(p);
  *p = (http1pr_s){
      .p.protocol =
          {
              .on_data = http1_on_data_first_time,
              .on_close = http1_on_close,
              .on_ready = http1_on_ready,
          },
      .p.uuid = uuid,
      .p.settings = settings,
      .max_header_size = settings->max_header_size,
      .is_client = settings->is_client,
  };
  http_s_new(&p->request, &p->p, &HTTP1_VTABLE);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    memcpy(p->buf, unread_data, unread_length);
    p->buf_len = unread_length;
  }
  fio_attach(uuid, &p->p.protocol);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    fio_force_event(uuid, FIO_EVENT_ON_DATA);
  }
  return &p->p.protocol;
}